

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game_impl.cpp
# Opt level: O2

void __thiscall gamespace::GameScreenImpl::createContextForLookAt(GameScreenImpl *this)

{
  ulong uVar1;
  BoardTile *pBVar2;
  Unit *pUVar3;
  UI *pUVar4;
  pointer plVar5;
  long lVar6;
  Unit *pUVar7;
  CoordinateMenu *this_00;
  Context *this_01;
  bool bVar8;
  UI *dui;
  layer_t *c;
  pointer plVar9;
  vec2 res;
  undefined1 auVar10 [16];
  dvec2 mp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pBVar2 = (this->_selection).hovering;
  if ((pBVar2 != (BoardTile *)0x0) && (pUVar3 = pBVar2->_unit, pUVar3 != (Unit *)0x0)) {
    pUVar4 = (this->_ui)._M_t.super___uniq_ptr_impl<ui::UI,_std::default_delete<ui::UI>_>._M_t.
             super__Tuple_impl<0UL,_ui::UI_*,_std::default_delete<ui::UI>_>.
             super__Head_base<0UL,_ui::UI_*,_false>._M_head_impl;
    plVar5 = *(pointer *)
              ((long)&(pUVar4->_layers).
                      super__Vector_base<ui::layer_t,_std::allocator<ui::layer_t>_> + 8);
    for (plVar9 = *(pointer *)
                   &(pUVar4->_layers).super__Vector_base<ui::layer_t,_std::allocator<ui::layer_t>_>;
        plVar9 != plVar5; plVar9 = plVar9 + 1) {
      std::__cxx11::string::string((string *)&local_50,(string *)plVar9);
      lVar6 = *(long *)((long)(plVar9->layer)._M_t.
                              super___uniq_ptr_impl<ui::Renderable,_std::default_delete<ui::Renderable>_>
                       + 0x90);
      bVar8 = std::operator==(&local_50,"unitctxt");
      if (bVar8) {
        pUVar7 = *(Unit **)(lVar6 + 0x50);
        std::__cxx11::string::~string((string *)&local_50);
        if (pUVar7 == pUVar3) {
          return;
        }
      }
      else {
        std::__cxx11::string::~string((string *)&local_50);
      }
    }
    this_00 = (CoordinateMenu *)(this->_selection).hovering;
    pBVar2 = (BoardTile *)
             (this->_ui)._M_t.super___uniq_ptr_impl<ui::UI,_std::default_delete<ui::UI>_>._M_t.
             super__Tuple_impl<0UL,_ui::UI_*,_std::default_delete<ui::UI>_>.
             super__Head_base<0UL,_ui::UI_*,_false>._M_head_impl;
    this_01 = this->_ctxt;
    uVar1._0_4_ = this_01->_w;
    uVar1._4_4_ = this_01->_h;
    auVar10._0_8_ = uVar1 & 0xffffffff;
    auVar10._8_4_ = uVar1._4_4_;
    auVar10._12_4_ = 0;
    res.field_0._0_4_ = (float)(SUB168(auVar10 | _DAT_001b4180,0) - (double)DAT_001b4180);
    res.field_0._4_4_ = (float)(SUB168(auVar10 | _DAT_001b4180,8) - DAT_001b4180._8_8_);
    mp = qe::Context::getMousePos(this_01);
    CoordinateMenu::createForTile(this_00,pBVar2,dui,res,mp);
  }
  return;
}

Assistant:

void GameScreenImpl::createContextForLookAt() {
    if(_selection.hovering == nullptr) return;
    auto *u = _selection.hovering->unit();
    if(u && _ui->hasModelMatching([u](std::string name, void *m){return name == "unitctxt" && ((CoordinateMenu*)m)->unit() == u;}) == false)
        CoordinateMenu::createForTile(_selection.hovering, _ui.get(), _ctxt->getResolution(), _ctxt->getMousePos());
}